

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::ExpressionStatement::tokenize(ExpressionStatement *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *pTVar1;
  Token local_50 [2];
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  ExpressionStatement *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  (*this->m_expression->_vptr_Expression[3])(this->m_expression,state,str);
  pTVar1 = local_20;
  Token::Token(&local_30,SEMICOLON);
  pTVar1 = TokenStream::operator<<(pTVar1,&local_30);
  Token::Token(local_50,NEWLINE);
  TokenStream::operator<<(pTVar1,local_50);
  Token::~Token(local_50);
  Token::~Token(&local_30);
  return;
}

Assistant:

void ExpressionStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	DE_ASSERT(m_expression);
	m_expression->tokenize(state, str);
	str << Token::SEMICOLON << Token::NEWLINE;
}